

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void __thiscall VmInstruction::AddArgument(VmInstruction *this,VmValue *argument)

{
  bool bVar1;
  VmValue *local_18;
  VmValue *argument_local;
  VmInstruction *this_local;
  
  local_18 = argument;
  argument_local = &this->super_VmValue;
  if (argument == (VmValue *)0x0) {
    __assert_fail("argument",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7b8,"void VmInstruction::AddArgument(VmValue *)");
  }
  bVar1 = VmType::operator!=(&argument->type,&VmType::Void);
  if (!bVar1) {
    __assert_fail("argument->type != VmType::Void",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7b9,"void VmInstruction::AddArgument(VmValue *)");
  }
  SmallArray<VmValue_*,_4U>::push_back(&this->arguments,&local_18);
  VmValue::AddUse(local_18,&this->super_VmValue);
  return;
}

Assistant:

void VmInstruction::AddArgument(VmValue *argument)
{
	assert(argument);
	assert(argument->type != VmType::Void);

	arguments.push_back(argument);

	argument->AddUse(this);
}